

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O3

double inform_information_flow
                 (int *src,int *dst,int *back,size_t l_src,size_t l_dst,size_t l_back,size_t n,
                 size_t m,int b,inform_error *err)

{
  long lVar1;
  _Bool _Var2;
  inform_error iVar3;
  void *__ptr;
  int *piVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  int b_state;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  size_t sVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  size_t N;
  size_t n_00;
  ulong uVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar34;
  uint uVar35;
  int iVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar44;
  uint uVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  uint uVar53;
  undefined1 auVar50 [16];
  uint uVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar56;
  undefined1 auVar55 [16];
  uint uVar57;
  uint uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  uint uVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uStack_e0;
  int local_a8;
  int local_90;
  long local_88;
  int local_80;
  int local_38;
  int local_34;
  undefined1 auVar48 [16];
  undefined1 auVar61 [16];
  
  if (((src == (int *)0x0 || l_src == 0) || (dst == (int *)0x0 || l_dst == 0)) ||
     (l_back != 0 && back == (int *)0x0)) {
    iVar3 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    iVar3 = INFORM_ENOINITS;
  }
  else if (m == 0) {
    iVar3 = INFORM_ESHORTSERIES;
  }
  else {
    if (1 < b) {
      n_00 = m * n;
      if (n_00 * l_src != 0) {
        lVar10 = 0;
        do {
          if (b <= src[lVar10]) goto LAB_00159206;
          if (src[lVar10] < 0) goto LAB_00159210;
          lVar10 = lVar10 + 1;
        } while (n_00 * l_src - lVar10 != 0);
      }
      if (n_00 * l_dst != 0) {
        lVar10 = 0;
        do {
          if (b <= dst[lVar10]) goto LAB_00159206;
          if (dst[lVar10] < 0) goto LAB_00159210;
          lVar10 = lVar10 + 1;
        } while (n_00 * l_dst - lVar10 != 0);
      }
      if (back != (int *)0x0) {
        if (n_00 * l_back != 0) {
          lVar10 = 0;
          do {
            if (b <= back[lVar10]) goto LAB_00159206;
            if (back[lVar10] < 0) goto LAB_00159210;
            lVar10 = lVar10 + 1;
          } while (n_00 * l_back - lVar10 != 0);
        }
        if (l_back != 0) {
          dVar24 = (double)b;
          auVar41._8_4_ = (int)(l_src >> 0x20);
          auVar41._0_8_ = l_src;
          auVar41._12_4_ = 0x45300000;
          dVar25 = pow(dVar24,(auVar41._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)l_src) - 4503599627370496.0));
          uVar18 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
          auVar26._8_4_ = (int)(l_dst >> 0x20);
          auVar26._0_8_ = l_dst;
          auVar26._12_4_ = 0x45300000;
          dVar25 = pow(dVar24,(auVar26._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)l_dst) - 4503599627370496.0));
          uVar8 = (long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25;
          auVar50._8_4_ = (int)(l_back >> 0x20);
          auVar50._0_8_ = l_back;
          auVar50._12_4_ = 0x45300000;
          dVar24 = pow(dVar24,(auVar50._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)l_back) - 4503599627370496.0));
          uVar5 = (long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24;
          lVar20 = uVar5 * uVar18;
          lVar19 = lVar20 * uVar8;
          lVar10 = uVar5 * uVar8;
          __ptr = calloc(lVar20 + uVar5 + lVar10 + lVar19,4);
          if (__ptr != (void *)0x0) {
            lVar20 = lVar20 * 4 + lVar19 * 4;
            lVar1 = lVar10 * 4 + lVar20;
            sVar6 = 0;
            do {
              sVar13 = 0;
              piVar4 = back;
              piVar11 = dst;
              piVar12 = src;
              do {
                iVar15 = 0;
                piVar17 = piVar12;
                sVar21 = l_src;
                do {
                  iVar15 = iVar15 * b + *piVar17;
                  piVar17 = piVar17 + n_00;
                  sVar21 = sVar21 - 1;
                } while (sVar21 != 0);
                iVar16 = 0;
                sVar21 = l_dst;
                piVar17 = piVar11;
                do {
                  iVar16 = iVar16 * b + *piVar17;
                  piVar17 = piVar17 + n_00;
                  sVar21 = sVar21 - 1;
                } while (sVar21 != 0);
                lVar22 = 0;
                sVar21 = l_back;
                piVar17 = piVar4;
                do {
                  lVar22 = (long)((int)lVar22 * b) + (long)*piVar17;
                  piVar17 = piVar17 + n_00;
                  sVar21 = sVar21 - 1;
                } while (sVar21 != 0);
                iVar36 = (int)uVar5;
                iVar16 = iVar16 * iVar36 + (int)lVar22;
                local_a8 = (int)lVar10;
                piVar17 = (int *)((long)__ptr + (long)(iVar15 * local_a8 + iVar16) * 4);
                *piVar17 = *piVar17 + 1;
                piVar17 = (int *)((long)__ptr +
                                 (long)(iVar15 * iVar36 + (int)lVar22) * 4 + lVar19 * 4);
                *piVar17 = *piVar17 + 1;
                piVar17 = (int *)((long)__ptr + (long)iVar16 * 4 + lVar20);
                *piVar17 = *piVar17 + 1;
                piVar17 = (int *)((long)__ptr + lVar22 * 4 + lVar1);
                *piVar17 = *piVar17 + 1;
                sVar13 = sVar13 + 1;
                piVar12 = piVar12 + 1;
                piVar11 = piVar11 + 1;
                piVar4 = piVar4 + 1;
              } while (sVar13 != m);
              sVar6 = sVar6 + 1;
              src = src + m;
              dst = dst + m;
              back = back + m;
            } while (sVar6 != n);
            if (iVar36 < 1) {
              dVar24 = 0.0;
            }
            else {
              dVar24 = 0.0;
              local_88 = 0;
              uVar14 = 0;
              do {
                local_90 = (int)uVar8;
                uVar31 = *(uint *)((long)__ptr + uVar14 * 4 + lVar1);
                if (uVar31 != 0 && 0 < local_90) {
                  uVar7 = uVar14 & 0xffffffff;
                  uVar9 = 0;
                  do {
                    local_80 = (int)uVar18;
                    uVar34 = *(uint *)((long)__ptr +
                                      (long)((int)uVar9 * iVar36 + (int)uVar14) * 4 + lVar20);
                    iVar15 = (int)uVar7;
                    if (uVar34 != 0 && 0 < local_80) {
                      lVar10 = local_88;
                      uVar23 = uVar18 & 0x7fffffff;
                      do {
                        uVar35 = *(uint *)((long)__ptr + (lVar10 >> 0x1e) + lVar19 * 4);
                        if ((uVar35 != 0) &&
                           (uVar53 = *(uint *)((long)__ptr + (long)(int)uVar7 * 4), uVar53 != 0)) {
                          dVar28 = (double)uVar53;
                          dVar25 = log2(((double)uVar31 * dVar28) /
                                        ((double)uVar35 * (double)uVar34));
                          dVar24 = dVar24 + dVar25 * dVar28;
                        }
                        lVar10 = lVar10 + (uVar5 << 0x20);
                        uVar7 = (ulong)(uint)((int)uVar7 + local_a8);
                        uVar23 = uVar23 - 1;
                      } while (uVar23 != 0);
                    }
                    uVar9 = uVar9 + 1;
                    uVar7 = (ulong)(uint)(iVar15 + iVar36);
                  } while (uVar9 != (uVar8 & 0x7fffffff));
                }
                uVar14 = uVar14 + 1;
                local_88 = local_88 + 0x100000000;
              } while (uVar14 != (uVar5 & 0x7fffffff));
            }
            free(__ptr);
            auVar27._0_8_ = (double)CONCAT44(0x43300000,(int)n_00);
            auVar27._8_4_ = (int)(n_00 >> 0x20);
            auVar27._12_4_ = 0x45300000;
            return dVar24 / ((auVar27._8_8_ - 1.9342813113834067e+25) +
                            (auVar27._0_8_ - 4503599627370496.0));
          }
          if (err == (inform_error *)0x0) {
            return NAN;
          }
          *err = INFORM_ENOMEM;
          return NAN;
        }
      }
      piVar4 = (int *)malloc((l_src + n_00 * 2 + l_dst) * 4);
      auVar26 = _DAT_00162140;
      if (piVar4 == (int *)0x0) {
        if (err == (inform_error *)0x0) {
          return NAN;
        }
        *err = INFORM_ENOMEM;
        return NAN;
      }
      lVar10 = l_src - 1;
      auVar29._8_4_ = (int)lVar10;
      auVar29._0_8_ = lVar10;
      auVar29._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar5 = 0;
      auVar29 = auVar29 ^ _DAT_00162140;
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar62 = _DAT_001632b0;
      auVar40 = _DAT_00160550;
      auVar60 = _DAT_0015fd50;
      do {
        auVar41 = auVar60;
        auVar50 = auVar40 ^ auVar26;
        uVar31 = -(uint)(auVar29._0_4_ < auVar50._0_4_);
        iVar15 = auVar29._4_4_;
        uVar34 = -(uint)(iVar15 < auVar50._4_4_);
        uVar35 = -(uint)(auVar29._8_4_ < auVar50._8_4_);
        iVar16 = auVar29._12_4_;
        iVar36 = -(uint)(iVar16 < auVar50._12_4_);
        uVar53 = -(uint)(auVar50._4_4_ == iVar15);
        uVar54 = -(uint)(auVar50._12_4_ == iVar16);
        if ((~(uVar34 | uVar53 & uVar31) & 1) != 0) {
          piVar4[n_00 * 2 + uVar5] = b;
        }
        if (((((ushort)iVar36 | (ushort)uVar54 & (ushort)uVar35) ^ 0xffff) & 1) != 0) {
          piVar4[n_00 * 2 + uVar5 + 1] = b;
        }
        auVar50 = auVar62 ^ auVar26;
        auVar55._0_4_ = -(uint)(auVar29._0_4_ < auVar50._0_4_);
        auVar55._4_4_ = -(uint)(iVar15 < auVar50._4_4_);
        auVar55._8_4_ = -(uint)(auVar29._8_4_ < auVar50._8_4_);
        auVar55._12_4_ = -(uint)(iVar16 < auVar50._12_4_);
        uVar57 = -(uint)(auVar50._4_4_ == iVar15);
        uVar58 = -(uint)(auVar50._12_4_ == iVar16);
        auVar63._4_4_ = uVar57;
        auVar63._0_4_ = uVar57;
        auVar63._8_4_ = uVar58;
        auVar63._12_4_ = uVar58;
        auVar59._4_4_ = auVar55._4_4_;
        auVar59._0_4_ = auVar55._4_4_;
        auVar59._8_4_ = auVar55._12_4_;
        auVar59._12_4_ = auVar55._12_4_;
        auVar50 = (auVar59 | auVar63 & auVar55) ^ auVar46;
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          piVar4[n_00 * 2 + uVar5 + 2] = b;
        }
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          piVar4[n_00 * 2 + uVar5 + 3] = b;
        }
        auVar60._0_4_ = auVar41._0_4_ * b;
        auVar61._8_4_ = (undefined4)((auVar41._8_8_ & 0xffffffff) * (ulong)(uint)b);
        auVar61._4_4_ = auVar61._8_4_;
        auVar61._0_4_ = auVar60._0_4_;
        iVar15 = auVar41._4_4_;
        auVar64._4_4_ = iVar15;
        auVar64._0_4_ = iVar15;
        auVar64._8_4_ = auVar41._12_4_;
        auVar64._12_4_ = auVar41._12_4_;
        auVar61._12_4_ = (int)((auVar64._8_8_ & 0xffffffff) * (ulong)(uint)b);
        auVar60._8_8_ = auVar61._8_8_;
        auVar60._4_4_ = iVar15 * b;
        uVar5 = uVar5 + 4;
        lVar10 = auVar40._8_8_;
        auVar40._0_8_ = auVar40._0_8_ + 4;
        auVar40._8_8_ = lVar10 + 4;
        lVar10 = auVar62._8_8_;
        auVar62._0_8_ = auVar62._0_8_ + 4;
        auVar62._8_8_ = lVar10 + 4;
      } while ((l_src + 3 & 0xfffffffffffffffc) != uVar5);
      auVar51._0_4_ = uVar53 & uVar31;
      auVar51._4_4_ = uVar54 & uVar35;
      auVar51._8_4_ = uVar57 & auVar55._0_4_;
      auVar51._12_4_ = uVar58 & auVar55._8_4_;
      auVar32._4_4_ = iVar36;
      auVar32._0_4_ = uVar34;
      auVar32._8_4_ = auVar55._4_4_;
      auVar32._12_4_ = auVar55._12_4_;
      auVar50 = ~(auVar32 | auVar51) & auVar60 | auVar41 & (auVar32 | auVar51);
      lVar10 = l_dst - 1;
      auVar30._8_4_ = (int)lVar10;
      auVar30._0_8_ = lVar10;
      auVar30._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar5 = 0;
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar33 = _DAT_001632b0;
      auVar37 = _DAT_00160550;
      auVar48 = _DAT_0015fd50;
      do {
        auVar27 = auVar48;
        auVar41 = auVar30 ^ auVar26;
        auVar62 = auVar37 ^ auVar26;
        uVar53 = -(uint)(auVar41._0_4_ < auVar62._0_4_);
        iVar15 = auVar41._4_4_;
        uVar31 = -(uint)(iVar15 < auVar62._4_4_);
        uVar54 = -(uint)(auVar41._8_4_ < auVar62._8_4_);
        iVar16 = auVar41._12_4_;
        uVar34 = -(uint)(iVar16 < auVar62._12_4_);
        uVar57 = -(uint)(auVar62._4_4_ == iVar15);
        uVar58 = -(uint)(auVar62._12_4_ == iVar16);
        uVar35 = auVar27._12_4_;
        if ((~(uVar31 | uVar57 & uVar53) & 1) != 0) {
          piVar4[n_00 * 2 + l_src + uVar5] = b;
        }
        if (((((ushort)uVar34 | (ushort)uVar58 & (ushort)uVar54) ^ 0xffff) & 1) != 0) {
          piVar4[n_00 * 2 + l_src + uVar5 + 1] = b;
        }
        auVar62 = auVar33 ^ auVar26;
        auVar52._0_4_ = -(uint)(auVar41._0_4_ < auVar62._0_4_);
        auVar52._4_4_ = -(uint)(iVar15 < auVar62._4_4_);
        auVar52._8_4_ = -(uint)(auVar41._8_4_ < auVar62._8_4_);
        auVar52._12_4_ = -(uint)(iVar16 < auVar62._12_4_);
        uVar65 = -(uint)(auVar62._4_4_ == iVar15);
        iVar15 = -(uint)(auVar62._12_4_ == iVar16);
        auVar47._4_4_ = uVar65;
        auVar47._0_4_ = uVar65;
        auVar47._8_4_ = iVar15;
        auVar47._12_4_ = iVar15;
        auVar42._4_4_ = auVar52._4_4_;
        auVar42._0_4_ = auVar52._4_4_;
        auVar42._8_4_ = auVar52._12_4_;
        auVar42._12_4_ = auVar52._12_4_;
        auVar41 = (auVar42 | auVar47 & auVar52) ^ auVar38;
        if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          piVar4[n_00 * 2 + l_src + uVar5 + 2] = b;
        }
        if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          piVar4[n_00 * 2 + l_src + uVar5 + 3] = b;
        }
        uVar39 = auVar27._0_4_ * b;
        uVar44 = (uint)((auVar27._8_8_ & 0xffffffff) * (ulong)(uint)b);
        auVar49._4_4_ = uVar44;
        auVar49._0_4_ = uVar39;
        uVar56 = auVar27._4_4_;
        auVar43._4_4_ = uVar56;
        auVar43._0_4_ = uVar56;
        auVar43._8_4_ = uVar35;
        auVar43._12_4_ = uVar35;
        uVar45 = (uint)((auVar43._8_8_ & 0xffffffff) * (ulong)(uint)b);
        auVar49._8_4_ = uVar44;
        auVar49._12_4_ = uVar45;
        auVar48._8_8_ = auVar49._8_8_;
        auVar48._4_4_ = uVar56 * b;
        auVar48._0_4_ = uVar39;
        uVar5 = uVar5 + 4;
        lVar10 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 4;
        auVar37._8_8_ = lVar10 + 4;
        lVar10 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + 4;
        auVar33._8_8_ = lVar10 + 4;
      } while ((l_dst + 3 & 0xfffffffffffffffc) != uVar5);
      inform_black_box(src,l_src,n,m,piVar4 + n_00 * 2,(size_t *)0x0,(size_t *)0x0,piVar4,err);
      _Var2 = inform_failed(err);
      if (_Var2) {
        return NAN;
      }
      inform_black_box(dst,l_dst,n,m,piVar4 + n_00 * 2 + l_src,(size_t *)0x0,(size_t *)0x0,
                       piVar4 + n_00,err);
      _Var2 = inform_failed(err);
      if (_Var2) {
        return NAN;
      }
      uVar31 = uVar31 | uVar57 & uVar53;
      uVar34 = uVar34 | uVar58 & uVar54;
      uVar53 = auVar52._4_4_ | uVar65 & auVar52._0_4_;
      uVar54 = auVar52._12_4_ | uVar65 & auVar52._8_4_;
      uStack_e0 = auVar27._8_4_;
      local_34 = (~uVar53 & uVar44 | uStack_e0 & uVar53) *
                 (~uVar31 & uVar39 | auVar27._0_4_ & uVar31) *
                 (~uVar34 & uVar56 * b | uVar56 & uVar34) * (~uVar54 & uVar45 | uVar35 & uVar54);
      local_38 = auVar50._8_4_ * auVar50._0_4_ * auVar50._4_4_ * auVar50._12_4_;
      dVar24 = inform_mutual_info(piVar4,2,n_00,&local_38,err);
      free(piVar4);
      return dVar24;
    }
    iVar3 = INFORM_EBASE;
  }
LAB_00158cbd:
  if (err != (inform_error *)0x0) {
    *err = iVar3;
  }
  return NAN;
LAB_00159206:
  iVar3 = INFORM_EBADSTATE;
  goto LAB_00158cbd;
LAB_00159210:
  iVar3 = INFORM_ENEGSTATE;
  goto LAB_00158cbd;
}

Assistant:

double inform_information_flow(int const *src, int const *dst, int const *back,
    size_t l_src, size_t l_dst, size_t l_back, size_t n, size_t m, int b,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l_src, l_dst, l_back, n, m, b, err))
    {
        return NAN;
    }

    if (back == NULL || l_back == 0)
    {
        return mutual_info(src, dst, l_src, l_dst, n, m, b, err);
    }

    size_t const N = n * m;

    size_t const a_size = pow((double) b, (double) l_src);
    size_t const b_size = pow((double) b, (double) l_dst);
    size_t const s_size = pow((double) b, (double) l_back);

    size_t const joint_size = a_size * b_size * s_size;
    size_t const as_size = a_size * s_size;
    size_t const bs_size = b_size * s_size;

    size_t const total_size = joint_size + as_size + bs_size + s_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist joint = { data, joint_size, N };
    inform_dist as    = { data + joint_size, as_size, N };
    inform_dist bs    = { data + joint_size + as_size, bs_size, N };
    inform_dist s     = { data + joint_size + as_size + bs_size, s_size, N };

    accumulate_observations(src, dst, back, l_src, l_dst, l_back, n, m, b,
        &joint, &as, &bs, &s);

    double flow = 0.0;
    int bs_state, as_state, joint_state;
    double ns, nbs, nas, njoint;
    for (int s_state = 0; s_state < (int) s_size; ++s_state)
    {
        ns = s.histogram[s_state];
        if (ns == 0)
        {
            continue;
        }
        for (int b_state = 0; b_state < (int) b_size; ++b_state)
        {
            bs_state = b_state * s_size + s_state;
            nbs = bs.histogram[bs_state];
            if (nbs == 0)
            {
                continue;
            }
            for (int a_state = 0; a_state < (int) a_size; ++a_state)
            {
                as_state = a_state * s_size + s_state;
                nas = as.histogram[as_state];
                if (nas == 0)
                {
                    continue;
                }
                joint_state = a_state * bs_size + bs_state;
                njoint = joint.histogram[joint_state];
                if (njoint == 0)
                {
                    continue;
                }
                flow += njoint * log2((njoint * ns) / (nas * nbs));
            }
        }
    }

    free(data);

    return flow / N;
}